

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_convolve.c
# Opt level: O2

void convolve_vert(uint8_t *src,ptrdiff_t src_stride,uint8_t *dst,ptrdiff_t dst_stride,
                  InterpKernel *y_filters,int y0_q4,int y_step_q4,int w,int h)

{
  int iVar1;
  uint8_t *puVar2;
  byte *pbVar3;
  int sum;
  int iVar4;
  int y_q4;
  uint uVar5;
  int k;
  long lVar6;
  int y;
  ulong uVar7;
  
  puVar2 = src + src_stride * -3;
  if (h < 1) {
    h = 0;
  }
  if (w < 1) {
    w = 0;
  }
  for (iVar1 = 0; iVar1 != w; iVar1 = iVar1 + 1) {
    uVar5 = y0_q4;
    for (uVar7 = 0; uVar7 != (uint)h; uVar7 = uVar7 + 1) {
      pbVar3 = puVar2 + ((int)uVar5 >> 4) * src_stride;
      iVar4 = 0;
      for (lVar6 = 0; lVar6 != 8; lVar6 = lVar6 + 1) {
        iVar4 = iVar4 + (int)*(short *)((long)*y_filters + lVar6 * 2 + (ulong)((uVar5 & 0xf) << 4))
                        * (uint)*pbVar3;
        pbVar3 = pbVar3 + src_stride;
      }
      iVar4 = iVar4 + 0x40 >> 7;
      if (iVar4 < 1) {
        iVar4 = 0;
      }
      if (0xfe < iVar4) {
        iVar4 = 0xff;
      }
      dst[uVar7 * dst_stride] = (uint8_t)iVar4;
      uVar5 = uVar5 + y_step_q4;
    }
    puVar2 = puVar2 + 1;
    dst = dst + 1;
  }
  return;
}

Assistant:

static void convolve_vert(const uint8_t *src, ptrdiff_t src_stride,
                          uint8_t *dst, ptrdiff_t dst_stride,
                          const InterpKernel *y_filters, int y0_q4,
                          int y_step_q4, int w, int h) {
  src -= src_stride * (SUBPEL_TAPS / 2 - 1);

  for (int x = 0; x < w; ++x) {
    int y_q4 = y0_q4;
    for (int y = 0; y < h; ++y) {
      const unsigned char *src_y = &src[(y_q4 >> SUBPEL_BITS) * src_stride];
      const int16_t *const y_filter = y_filters[y_q4 & SUBPEL_MASK];
      const int sum = vert_scalar_product(src_y, src_stride, y_filter);
      dst[y * dst_stride] = clip_pixel(ROUND_POWER_OF_TWO(sum, FILTER_BITS));
      y_q4 += y_step_q4;
    }
    ++src;
    ++dst;
  }
}